

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenerators.cxx
# Opt level: O2

string * __thiscall
cmQtAutoGenerators::ListQt5RccInputs
          (string *__return_storage_ptr__,cmQtAutoGenerators *this,cmSourceFile *sf,cmTarget *target
          ,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *depends)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  istream *piVar4;
  long lVar5;
  ostream *poVar6;
  int retVal;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  qrcEntries;
  string oline;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  string rccStdErr;
  string rccStdOut;
  string absFile;
  string local_210;
  string rccCommand;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  istringstream ostr;
  
  GetRccExecutable_abi_cxx11_(&rccCommand,this,target);
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  qrcEntries.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&command,&rccCommand);
  std::__cxx11::string::string((string *)&ostr,"--list",(allocator *)&absFile);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&command,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  psVar3 = cmSourceFile::GetFullPath(sf,(string *)0x0);
  cmsys::SystemTools::GetRealPath(&absFile,psVar3,(string *)0x0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&command,&absFile);
  rccStdOut._M_dataplus._M_p = (pointer)&rccStdOut.field_2;
  rccStdOut._M_string_length = 0;
  rccStdOut.field_2._M_local_buf[0] = '\0';
  rccStdErr._M_dataplus._M_p = (pointer)&rccStdErr.field_2;
  rccStdErr._M_string_length = 0;
  rccStdErr.field_2._M_local_buf[0] = '\0';
  retVal = 0;
  bVar1 = cmSystemTools::RunSingleCommand
                    (&command,&rccStdOut,&rccStdErr,&retVal,(char *)0x0,OUTPUT_NONE,0.0);
  if (bVar1 && retVal == 0) {
    std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)&rccStdOut,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ostr,(string *)&oline);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      cmQtAutoGeneratorsStripCR(&local_210,&oline);
      std::__cxx11::string::operator=((string *)&oline,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      if (oline._M_string_length != 0) {
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&qrcEntries,&oline);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
    std::__cxx11::istringstream::istringstream((istringstream *)&ostr,(string *)&rccStdErr,_S_in);
    oline._M_string_length = 0;
    oline.field_2._M_local_buf[0] = '\0';
    oline._M_dataplus._M_p = (pointer)&oline.field_2;
    while( true ) {
      piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&ostr,(string *)&oline);
      if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) != 0) break;
      cmQtAutoGeneratorsStripCR(&local_210,&oline);
      std::__cxx11::string::operator=((string *)&oline,(string *)&local_210);
      std::__cxx11::string::~string((string *)&local_210);
      std::__cxx11::string::string((string *)&local_1d0,(string *)&oline);
      bVar1 = cmHasLiteralPrefix<std::__cxx11::string,14ul>
                        (&local_1d0,(char (*) [14])"RCC: Error in");
      std::__cxx11::string::~string((string *)&local_1d0);
      if (bVar1) {
        if (ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
            ::searchString_abi_cxx11_ == '\0') {
          iVar2 = __cxa_guard_acquire(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::searchString_abi_cxx11_);
          if (iVar2 != 0) {
            std::__cxx11::string::string
                      ((string *)
                       &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                        ::searchString_abi_cxx11_,"Cannot find file \'",(allocator *)&local_210);
            __cxa_atexit(std::__cxx11::string::~string,
                         &ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                          ::searchString_abi_cxx11_,&__dso_handle);
            __cxa_guard_release(&ListQt5RccInputs(cmSourceFile*,cmTarget_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                 ::searchString_abi_cxx11_);
          }
        }
        lVar5 = std::__cxx11::string::find((string *)&oline,0x5ca630);
        if (lVar5 == -1) {
          poVar6 = std::operator<<((ostream *)&std::cerr,
                                   "AUTOGEN: error: Rcc lists unparsable output ");
          poVar6 = std::operator<<(poVar6,(string *)&oline);
          std::endl<char,std::char_traits<char>>(poVar6);
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::string::~string((string *)&oline);
          std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
          goto LAB_002f9e4f;
        }
        std::__cxx11::string::substr((ulong)&local_210,(ulong)&oline);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&qrcEntries,
                   &local_210);
        std::__cxx11::string::~string((string *)&local_210);
      }
    }
    std::__cxx11::string::~string((string *)&oline);
    std::__cxx11::istringstream::~istringstream((istringstream *)&ostr);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)depends,
               (depends->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )qrcEntries.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )qrcEntries.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              (__return_storage_ptr__,&qrcEntries,"@list_sep@");
  }
  else {
    poVar6 = std::operator<<((ostream *)&std::cerr,"AUTOGEN: error: Rcc list process for ");
    psVar3 = cmSourceFile::GetFullPath(sf,(string *)0x0);
    poVar6 = std::operator<<(poVar6,(string *)psVar3);
    poVar6 = std::operator<<(poVar6," failed:\n");
    poVar6 = std::operator<<(poVar6,(string *)&rccStdOut);
    poVar6 = std::operator<<(poVar6,"\n");
    poVar6 = std::operator<<(poVar6,(string *)&rccStdErr);
    std::endl<char,std::char_traits<char>>(poVar6);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
LAB_002f9e4f:
  std::__cxx11::string::~string((string *)&rccStdErr);
  std::__cxx11::string::~string((string *)&rccStdOut);
  std::__cxx11::string::~string((string *)&absFile);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&command);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&qrcEntries);
  std::__cxx11::string::~string((string *)&rccCommand);
  return __return_storage_ptr__;
}

Assistant:

std::string cmQtAutoGenerators::ListQt5RccInputs(cmSourceFile* sf,
                                            cmTarget const* target,
                                            std::vector<std::string>& depends)
{
  std::string rccCommand = this->GetRccExecutable(target);
  std::vector<std::string> qrcEntries;

  std::vector<std::string> command;
  command.push_back(rccCommand);
  command.push_back("--list");

  std::string absFile = cmsys::SystemTools::GetRealPath(
                                              sf->GetFullPath());

  command.push_back(absFile);

  std::string rccStdOut;
  std::string rccStdErr;
  int retVal = 0;
  bool result = cmSystemTools::RunSingleCommand(
    command, &rccStdOut, &rccStdErr,
    &retVal, 0, cmSystemTools::OUTPUT_NONE);
  if (!result || retVal)
    {
    std::cerr << "AUTOGEN: error: Rcc list process for " << sf->GetFullPath()
              << " failed:\n" << rccStdOut << "\n" << rccStdErr << std::endl;
    return std::string();
    }

  {
  std::istringstream ostr(rccStdOut);
  std::string oline;
  while(std::getline(ostr, oline))
    {
    oline = cmQtAutoGeneratorsStripCR(oline);
    if(!oline.empty())
      {
      qrcEntries.push_back(oline);
      }
    }
  }

  {
  std::istringstream estr(rccStdErr);
  std::string eline;
  while(std::getline(estr, eline))
    {
    eline = cmQtAutoGeneratorsStripCR(eline);
    if (cmHasLiteralPrefix(eline, "RCC: Error in"))
      {
      static std::string searchString = "Cannot find file '";

      std::string::size_type pos = eline.find(searchString);
      if (pos == std::string::npos)
        {
        std::cerr << "AUTOGEN: error: Rcc lists unparsable output "
                  << eline << std::endl;
        return std::string();
        }
      pos += searchString.length();
      std::string::size_type sz = eline.size() - pos - 1;
      qrcEntries.push_back(eline.substr(pos, sz));
      }
    }
  }

  depends.insert(depends.end(), qrcEntries.begin(), qrcEntries.end());
  return cmJoin(qrcEntries, "@list_sep@");
}